

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ExclusiveBetweenOperator,false,false,true>
                (hugeint_t *adata,hugeint_t *bdata,hugeint_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong row_idx;
  ulong row_idx_00;
  idx_t i;
  ulong uVar5;
  ulong row_idx_01;
  long lVar6;
  
  uVar5 = 0;
  lVar6 = 0;
  do {
    if (count == uVar5) {
      return count - lVar6;
    }
    uVar4 = uVar5;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)result_sel->sel_vector[uVar5];
    }
    row_idx_01 = uVar5;
    if (asel->sel_vector != (sel_t *)0x0) {
      row_idx_01 = (ulong)asel->sel_vector[uVar5];
    }
    row_idx_00 = uVar5;
    if (bsel->sel_vector != (sel_t *)0x0) {
      row_idx_00 = (ulong)bsel->sel_vector[uVar5];
    }
    row_idx = uVar5;
    if (csel->sel_vector != (sel_t *)0x0) {
      row_idx = (ulong)csel->sel_vector[uVar5];
    }
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&avalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
    uVar3 = 1;
    if (bVar2) {
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&bvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      uVar3 = 1;
      if (bVar2) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&cvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
        uVar3 = 1;
        if (bVar2) {
          lVar1 = adata[row_idx_01].upper;
          if (lVar1 <= bdata[row_idx_00].upper) {
            uVar3 = 1;
            if (adata[row_idx_01].lower <= bdata[row_idx_00].lower ||
                lVar1 != bdata[row_idx_00].upper) goto LAB_01808d4c;
          }
          uVar3 = (ulong)((cdata[row_idx].lower <= adata[row_idx_01].lower ||
                          cdata[row_idx].upper != lVar1) && cdata[row_idx].upper <= lVar1);
        }
      }
    }
LAB_01808d4c:
    false_sel->sel_vector[lVar6] = (sel_t)uVar4;
    lVar6 = lVar6 + uVar3;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}